

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse.h
# Opt level: O0

void FSE_encodeSymbol(BIT_CStream_t *bitC,FSE_CState_t *statePtr,uint symbol)

{
  ulong uVar1;
  void *pvVar2;
  long lVar3;
  U32 nbBitsOut;
  U16 *stateTable;
  FSE_symbolCompressionTransform symbolTT;
  uint symbol_local;
  FSE_CState_t *statePtr_local;
  BIT_CStream_t *bitC_local;
  
  uVar1 = *(ulong *)((long)statePtr->symbolTT + (ulong)symbol * 8);
  pvVar2 = statePtr->stateTable;
  lVar3 = statePtr->value + (uVar1 >> 0x20);
  BIT_addBits(bitC,statePtr->value,(uint)((ulong)lVar3 >> 0x10));
  stateTable._4_4_ = (int)uVar1;
  statePtr->value =
       (ulong)*(ushort *)
               ((long)pvVar2 +
               ((statePtr->value >> ((byte)((ulong)lVar3 >> 0x10) & 0x3f)) + (long)stateTable._4_4_)
               * 2);
  return;
}

Assistant:

MEM_STATIC void FSE_encodeSymbol(BIT_CStream_t* bitC, FSE_CState_t* statePtr, unsigned symbol)
{
    FSE_symbolCompressionTransform const symbolTT = ((const FSE_symbolCompressionTransform*)(statePtr->symbolTT))[symbol];
    const U16* const stateTable = (const U16*)(statePtr->stateTable);
    U32 const nbBitsOut  = (U32)((statePtr->value + symbolTT.deltaNbBits) >> 16);
    BIT_addBits(bitC, statePtr->value, nbBitsOut);
    statePtr->value = stateTable[ (statePtr->value >> nbBitsOut) + symbolTT.deltaFindState];
}